

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

void __thiscall
booster::aio::anon_unknown_15::reader_all::operator()(reader_all *this,error_code *e)

{
  mutable_buffer *buffer;
  atomic_counter *this_00;
  pointer peVar1;
  stream_socket *this_01;
  bool bVar2;
  size_t n;
  error_code err;
  error_code local_58;
  mutable_buffer local_48;
  
  if (e->_M_value != 0) {
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(&this->h,e,this->count);
    return;
  }
  local_58._M_value = 0;
  local_58._M_cat = (error_category *)std::_V2::system_category();
  buffer = &this->buf;
  n = stream_socket::read_some(this->self,buffer,&local_58);
  this->count = this->count + n;
  details::advance<booster::aio::mutable_buffer>(&local_48,buffer,n);
  (this->buf).super_buffer_impl<char_*>.entry_.size = local_48.super_buffer_impl<char_*>.entry_.size
  ;
  (this->buf).super_buffer_impl<char_*>.size_ = local_48.super_buffer_impl<char_*>.size_;
  *(undefined4 *)&(this->buf).super_buffer_impl<char_*>.field_0x4 =
       local_48.super_buffer_impl<char_*>._4_4_;
  (this->buf).super_buffer_impl<char_*>.entry_.ptr = local_48.super_buffer_impl<char_*>.entry_.ptr;
  peVar1 = (this->buf).super_buffer_impl<char_*>.vec_.
           super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->buf).super_buffer_impl<char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.super_buffer_impl<char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->buf).super_buffer_impl<char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.super_buffer_impl<char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->buf).super_buffer_impl<char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super_buffer_impl<char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super_buffer_impl<char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super_buffer_impl<char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super_buffer_impl<char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1);
    if (local_48.super_buffer_impl<char_*>.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super_buffer_impl<char_*>.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((buffer->super_buffer_impl<char_*>).size_ == 0) {
LAB_00167351:
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (&this->h,&local_58,this->count);
  }
  else {
    if (local_58._M_value != 0) {
      bVar2 = basic_io_device::would_block(&local_58);
      if (!bVar2) goto LAB_00167351;
    }
    this_01 = this->self;
    this_00 = &(this->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_;
    atomic_counter::inc(this_00);
    local_48.super_buffer_impl<char_*>._0_8_ = this;
    atomic_counter::inc(this_00);
    basic_io_device::on_readable((basic_io_device *)this_01,(event_handler *)&local_48);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_48);
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr
              ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)this);
  }
  return;
}

Assistant:

void operator()(system::error_code const &e)
		{
			if(e) {
				h(e,count);
			}
			else {
				system::error_code err;
				size_t n=self->read_some(buf,err);
				count+=n;
				buf+=n;
				if(buf.empty() || (err && !basic_io_device::would_block(err))) {
					h(err,count);
				}
				else {
					self->on_readable(intrusive_ptr<reader_all>(this));
				}
			}
		}